

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int record_receipt(st_quicly_pn_space_t *space,uint64_t pn,int is_ack_only,int64_t now,
                  int64_t *send_ack_at)

{
  size_t sVar1;
  quicly_range_t *pqVar2;
  ulong end_range_index;
  bool bVar3;
  uint uVar4;
  int iVar5;
  bool bVar6;
  
  sVar1 = (space->ack_queue).num_ranges;
  if (sVar1 == 0) {
    bVar3 = false;
  }
  else {
    pqVar2 = (space->ack_queue).ranges;
    bVar3 = true;
    if (pqVar2[sVar1 - 1].end == pn) {
      pqVar2[sVar1 - 1].end = pn + 1;
      bVar3 = false;
      iVar5 = 0;
      goto LAB_001225bd;
    }
  }
  iVar5 = quicly_ranges_add(&space->ack_queue,pn,pn + 1);
  if (iVar5 == 0) {
    end_range_index = (space->ack_queue).num_ranges;
    iVar5 = 0;
    if (0x40 < end_range_index) {
      quicly_ranges_drop_by_range_indices(&space->ack_queue,end_range_index - 0x40,end_range_index);
    }
  }
LAB_001225bd:
  if (iVar5 == 0) {
    bVar6 = false;
    if ((bVar3) && (space->ignore_order == '\0')) {
      bVar6 = is_ack_only == 0;
    }
    if ((space->ack_queue).ranges[(space->ack_queue).num_ranges - 1].end == pn + 1) {
      space->largest_pn_received_at = now;
    }
    if ((is_ack_only == 0) &&
       (uVar4 = space->unacked_count + 1, space->unacked_count = uVar4,
       space->packet_tolerance <= uVar4)) {
      bVar6 = true;
    }
    if (!bVar6) {
      if (*send_ack_at != 0x7fffffffffffffff) {
        return 0;
      }
      if (space->unacked_count == 0) {
        return 0;
      }
      now = now + 0x19;
    }
    *send_ack_at = now;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int record_receipt(struct st_quicly_pn_space_t *space, uint64_t pn, int is_ack_only, int64_t now, int64_t *send_ack_at)
{
    int ret, ack_now, is_out_of_order;

    if ((ret = record_pn(&space->ack_queue, pn, &is_out_of_order)) != 0)
        goto Exit;

    ack_now = is_out_of_order && !space->ignore_order && !is_ack_only;

    /* update largest_pn_received_at (TODO implement deduplication at an earlier moment?) */
    if (space->ack_queue.ranges[space->ack_queue.num_ranges - 1].end == pn + 1)
        space->largest_pn_received_at = now;

    /* if the received packet is ack-eliciting, update / schedule transmission of ACK */
    if (!is_ack_only) {
        space->unacked_count++;
        if (space->unacked_count >= space->packet_tolerance)
            ack_now = 1;
    }

    if (ack_now) {
        *send_ack_at = now;
    } else if (*send_ack_at == INT64_MAX && space->unacked_count != 0) {
        *send_ack_at = now + QUICLY_DELAYED_ACK_TIMEOUT;
    }

    ret = 0;
Exit:
    return ret;
}